

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void Rml::Log::ParseError(String *filename,int line_number,char *fmt,...)

{
  char in_AL;
  undefined8 uVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_508 [24];
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  int local_44c;
  undefined4 local_448;
  int len;
  va_list argument_list;
  char local_428 [8];
  char buffer [1024];
  int buffer_size;
  char *fmt_local;
  int line_number_local;
  String *filename_local;
  
  if (in_AL != '\0') {
    local_4d8 = in_XMM0_Qa;
    local_4c8 = in_XMM1_Qa;
    local_4b8 = in_XMM2_Qa;
    local_4a8 = in_XMM3_Qa;
    local_498 = in_XMM4_Qa;
    local_488 = in_XMM5_Qa;
    local_478 = in_XMM6_Qa;
    local_468 = in_XMM7_Qa;
  }
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\x04';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  argument_list[0].overflow_arg_area = local_508;
  argument_list[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_448 = 0x18;
  local_4f0 = in_RCX;
  local_4e8 = in_R8;
  local_4e0 = in_R9;
  local_44c = vsnprintf(local_428,0x3fe,fmt,&local_448);
  if ((local_44c < 0) || (0x3fe < local_44c)) {
    local_44c = 0x3fe;
  }
  local_428[local_44c] = '\0';
  if (line_number < 0) {
    uVar1 = ::std::__cxx11::string::c_str();
    Message(LT_ERROR,"%s: %s",uVar1,local_428);
  }
  else {
    uVar1 = ::std::__cxx11::string::c_str();
    Message(LT_ERROR,"%s:%d: %s",uVar1,(ulong)(uint)line_number,local_428);
  }
  return;
}

Assistant:

void Log::ParseError(const String& filename, int line_number, const char* fmt, ...)
{
	const int buffer_size = 1024;
	char buffer[buffer_size];
	va_list argument_list;

	// Print the message to the buffer.
	va_start(argument_list, fmt);
	int len = vsnprintf(buffer, buffer_size - 2, fmt, argument_list);
	if (len < 0 || len > buffer_size - 2)
	{
		len = buffer_size - 2;
	}
	buffer[len] = '\0';
	va_end(argument_list);

	if (line_number >= 0)
		Message(Log::LT_ERROR, "%s:%d: %s", filename.c_str(), line_number, buffer);
	else
		Message(Log::LT_ERROR, "%s: %s", filename.c_str(), buffer);
}